

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_fb33fd::TransformReplace::Transform
          (string *__return_storage_ptr__,TransformReplace *this,string *input)

{
  bool bVar1;
  runtime_error *this_00;
  string sStack_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = cmStringReplaceHelper::Replace(&this->ReplaceHelper,input,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_58.View_._M_len = 0x27;
  local_58.View_._M_str = "sub-command TRANSFORM, action REPLACE: ";
  local_88.View_._M_str = (this->ReplaceHelper).ErrorString._M_dataplus._M_p;
  local_88.View_._M_len = (this->ReplaceHelper).ErrorString._M_string_length;
  cmStrCat<char[2]>(&sStack_a8,&local_58,&local_88,(char (*) [2])0x6ecf14);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_a8);
  *(undefined ***)this_00 = &PTR__runtime_error_008cd230;
  __cxa_throw(this_00,&(anonymous_namespace)::transform_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

std::string Transform(const std::string& input) override
  {
    // Scan through the input for all matches.
    std::string output;

    if (!this->ReplaceHelper.Replace(input, output)) {
      throw transform_error(cmStrCat("sub-command TRANSFORM, action REPLACE: ",
                                     this->ReplaceHelper.GetError(), "."));
    }

    return output;
  }